

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_SimdBool16x8<Js::OpLayoutT_Bool16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Bool16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  long lVar1;
  long lVar2;
  SIMDValue SVar3;
  bool local_20;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  bool values [8];
  
  lVar1 = *(long *)(this + 0x118);
  local_20 = *(int *)(lVar1 + (ulong)playout->I1 * 4) != 0;
  local_1f = *(int *)(lVar1 + (ulong)playout->I2 * 4) != 0;
  local_1e = *(int *)(lVar1 + (ulong)playout->I3 * 4) != 0;
  local_1d = *(int *)(lVar1 + (ulong)playout->I4 * 4) != 0;
  local_1c = *(int *)(lVar1 + (ulong)playout->I5 * 4) != 0;
  local_1b = *(int *)(lVar1 + (ulong)playout->I6 * 4) != 0;
  local_1a = *(int *)(lVar1 + (ulong)playout->I7 * 4) != 0;
  local_19 = *(int *)(lVar1 + (ulong)playout->I8 * 4) != 0;
  SVar3 = SIMDBool16x8Operation::OpBool16x8(&local_20);
  lVar1 = *(long *)(this + 0x148);
  lVar2 = (ulong)playout->B8_0 * 0x10;
  *(long *)(lVar1 + lVar2) = SVar3.field_0._0_8_;
  *(long *)(lVar1 + 8 + lVar2) = SVar3.field_0._8_8_;
  return;
}

Assistant:

void InterpreterStackFrame::OP_SimdBool16x8(const unaligned T* playout)
    {
        bool values[8];
        values[0] = GetRegRawInt(playout->I1) ? true : false;
        values[1] = GetRegRawInt(playout->I2) ? true : false;
        values[2] = GetRegRawInt(playout->I3) ? true : false;
        values[3] = GetRegRawInt(playout->I4) ? true : false;
        values[4] = GetRegRawInt(playout->I5) ? true : false;
        values[5] = GetRegRawInt(playout->I6) ? true : false;
        values[6] = GetRegRawInt(playout->I7) ? true : false;
        values[7] = GetRegRawInt(playout->I8) ? true : false;

        AsmJsSIMDValue result = SIMDBool16x8Operation::OpBool16x8(values);
        SetRegRawSimd(playout->B8_0, result);
    }